

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O2

int __thiscall ncnn::Reshape::load_param(Reshape *this,ParamDict *pd)

{
  string *expr;
  int iVar1;
  int iVar2;
  allocator<char> local_79;
  vector<int,_std::allocator<int>_> outshape;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> blobs;
  
  iVar1 = ParamDict::get(pd,0,-0xe9);
  this->w = iVar1;
  iVar1 = ParamDict::get(pd,1,-0xe9);
  this->h = iVar1;
  iVar1 = ParamDict::get(pd,0xb,-0xe9);
  this->d = iVar1;
  iVar2 = ParamDict::get(pd,2,-0xe9);
  this->c = iVar2;
  iVar1 = (this->d != -0xe9) + 3;
  if (iVar2 == -0xe9) {
    iVar1 = 2;
  }
  if (this->h == -0xe9) {
    iVar1 = 1;
  }
  if (this->w == -0xe9) {
    iVar1 = 0;
  }
  this->ndim = iVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&outshape,"",&local_79);
  ParamDict::get((string *)&blobs,pd,6,(string *)&outshape);
  expr = &this->shape_expr;
  std::__cxx11::string::operator=((string *)expr,(string *)&blobs);
  std::__cxx11::string::~string((string *)&blobs);
  std::__cxx11::string::~string((string *)&outshape);
  iVar1 = 0;
  if ((this->shape_expr)._M_string_length != 0) {
    iVar1 = count_expression_blobs(expr);
    if (1 < iVar1) {
      (this->super_Layer).one_blob_only = false;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&blobs,(long)iVar1,(allocator_type *)&outshape);
    outshape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    outshape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    outshape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar1 = eval_list_expression(expr,&blobs,&outshape);
    if (iVar1 == 0) {
      this->ndim = (int)((ulong)((long)outshape.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)outshape.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&outshape.super__Vector_base<int,_std::allocator<int>_>);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&blobs);
      iVar1 = 0;
    }
    else {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&outshape.super__Vector_base<int,_std::allocator<int>_>);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&blobs);
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int Reshape::load_param(const ParamDict& pd)
{
    w = pd.get(0, -233);
    h = pd.get(1, -233);
    d = pd.get(11, -233);
    c = pd.get(2, -233);

    ndim = 4;
    if (d == -233)
        ndim = 3;
    if (c == -233)
        ndim = 2;
    if (h == -233)
        ndim = 1;
    if (w == -233)
        ndim = 0;

    shape_expr = pd.get(6, "");

    // count reference blobs
    if (!shape_expr.empty())
    {
        const int blob_count = count_expression_blobs(shape_expr);
        if (blob_count > 1)
            one_blob_only = false;

        // resolve ndim from expression
        std::vector<Mat> blobs(blob_count);
        std::vector<int> outshape;
        int er = eval_list_expression(shape_expr, blobs, outshape);
        if (er != 0)
            return -1;

        ndim = (int)outshape.size();
    }

    return 0;
}